

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depfile_parser.cc
# Opt level: O1

bool __thiscall DepfileParser::Parse(DepfileParser *this,string *content,string *err)

{
  pointer *ppSVar1;
  iterator iVar2;
  bool bVar3;
  bool bVar4;
  DepfileParser *this_00;
  byte bVar5;
  bool bVar6;
  uint uVar7;
  __normal_iterator<StringPiece_*,_std::vector<StringPiece,_std::allocator<StringPiece>_>_> _Var8;
  bool bVar9;
  long lVar10;
  byte *pbVar11;
  byte *pbVar12;
  bool bVar13;
  uint uVar14;
  byte *__s;
  byte *pbVar15;
  int iVar16;
  StringPiece piece;
  StringPiece local_68;
  string *local_58;
  byte *local_50;
  vector<StringPiece,std::allocator<StringPiece>> *local_48;
  DepfileParser *local_40;
  byte *local_38;
  
  pbVar11 = (byte *)(content->_M_dataplus)._M_p;
  local_38 = pbVar11 + content->_M_string_length;
  local_48 = (vector<StringPiece,std::allocator<StringPiece>> *)&this->ins_;
  bVar4 = true;
  bVar13 = false;
  bVar6 = false;
  local_58 = err;
  local_40 = this;
  do {
    if (local_38 <= pbVar11) {
      if (bVar6) {
        return true;
      }
      std::__cxx11::string::_M_replace
                ((ulong)local_58,0,(char *)local_58->_M_string_length,0x1296a0);
      return false;
    }
    bVar9 = false;
    pbVar12 = pbVar11;
    __s = pbVar11;
    local_50 = pbVar11;
    do {
      bVar5 = *pbVar12;
      uVar14 = (uint)pbVar12;
      pbVar15 = pbVar12;
      if ((char)""[bVar5] < '\0') {
        do {
          pbVar11 = pbVar15 + 1;
          pbVar15 = pbVar15 + 1;
        } while ((char)""[*pbVar11] < '\0');
LAB_00124f68:
        iVar16 = (int)pbVar15 - uVar14;
        if (__s < pbVar12) {
          memmove(__s,pbVar12,(long)iVar16);
        }
        __s = __s + iVar16;
        pbVar11 = pbVar15;
LAB_00124f87:
        bVar3 = false;
        goto LAB_00125015;
      }
      if (bVar5 < 0xe) {
        if (bVar5 < 10) goto LAB_00125000;
        if (bVar5 == 10) {
LAB_00125007:
          pbVar11 = pbVar12 + 1;
          bVar9 = true;
        }
        else {
          if (bVar5 != 0xd) goto LAB_00125000;
          pbVar11 = pbVar12 + 1;
          pbVar15 = pbVar12 + 1;
          pbVar12 = pbVar11;
          if (*pbVar15 == 10) goto LAB_00125007;
        }
        bVar3 = true;
      }
      else {
        if (bVar5 < 0x25) {
          if ((bVar5 == 0x24) && (pbVar12[1] == 0x24)) {
            pbVar11 = pbVar12 + 2;
            *__s = 0x24;
            __s = __s + 1;
            bVar3 = false;
            goto LAB_00125015;
          }
        }
        else if ((byte)(bVar5 - 0x40) < 0x1d) {
          pbVar11 = pbVar12 + 1;
          bVar5 = pbVar12[1];
          pbVar15 = pbVar11;
          if (0x20 < bVar5) {
            if (bVar5 < 0x3a) {
LAB_0012502a:
              pbVar15 = pbVar11;
              if (bVar5 != 0x23) goto LAB_00125239;
              pbVar11 = pbVar11 + 1;
              iVar16 = (int)((long)pbVar11 - (long)pbVar12);
              if ((2 < iVar16) && (__s < pbVar12)) {
                memset(__s,0x5c,(ulong)(iVar16 - 2));
              }
              pbVar12 = __s + (((long)pbVar11 - (long)pbVar12 << 0x20) + -0x200000000 >> 0x20);
              __s = pbVar12 + 1;
              *pbVar12 = 0x23;
              goto LAB_00124f87;
            }
            if (bVar5 != 0x3a) {
              if (bVar5 == 0x5c) {
                lVar10 = 0x200000000;
                pbVar11 = pbVar12 + 3;
                do {
                  bVar5 = pbVar11[-1];
                  if (bVar5 < 0x21) {
                    pbVar15 = pbVar11 + -1;
                    if (bVar5 < 0xb) {
                      pbVar11 = pbVar15;
                      if (bVar5 == 0) goto LAB_00124f68;
LAB_00125269:
                      pbVar15 = pbVar11;
                      if (bVar5 == 10) goto LAB_00124f68;
                      goto LAB_00125239;
                    }
                    if (bVar5 == 0xd) goto LAB_00124f68;
                    if (bVar5 != 0x20) goto LAB_00125239;
                    if (__s < pbVar12) {
                      memset(__s,0x5c,lVar10 >> 0x20);
                    }
                    __s = __s + (lVar10 >> 0x20);
                    bVar3 = true;
                    goto LAB_00125015;
                  }
                  if (bVar5 < 0x3a) {
                    pbVar11 = pbVar11 + -1;
                    goto LAB_0012502a;
                  }
                  if (bVar5 != 0x5c) {
                    pbVar15 = pbVar11 + -1;
                    break;
                  }
                  bVar5 = *pbVar11;
                  pbVar15 = pbVar11;
                  if (bVar5 < 0x21) {
                    if (bVar5 < 0xb) {
                      if (bVar5 != 0) goto LAB_00125269;
                      goto LAB_00124f68;
                    }
                    if (bVar5 != 0xd) goto LAB_0012508a;
                    goto LAB_00124f68;
                  }
                  if (bVar5 < 0x3a) goto LAB_0012502a;
                  lVar10 = lVar10 + 0x200000000;
                  pbVar11 = pbVar11 + 2;
                } while (bVar5 == 0x5c);
                if (bVar5 == 0x3a) goto LAB_00125173;
              }
LAB_00125239:
              pbVar15 = pbVar15 + 1;
              goto LAB_00124f68;
            }
LAB_00125173:
            pbVar11 = pbVar15 + 1;
            bVar5 = pbVar15[1];
            uVar7 = (uint)bVar5;
            if (bVar5 < 0xd) {
              if ((uVar7 < 0xb) && ((0x601U >> (uVar7 & 0x1f) & 1) != 0)) {
LAB_0012519c:
                iVar16 = ~uVar14 + (int)pbVar15 + 2;
                if (__s < pbVar12) {
                  memmove(__s,pbVar12,(long)iVar16);
                }
                __s = __s + iVar16;
                bVar5 = *pbVar11;
                pbVar11 = pbVar15 + 2;
                if (bVar5 == 10) {
                  bVar9 = true;
                }
                goto LAB_001251df;
              }
            }
            else if ((bVar5 == 0xd) || (uVar7 == 0x20)) goto LAB_0012519c;
            iVar16 = (int)((long)pbVar11 - (long)pbVar12);
            if ((2 < iVar16) && (__s < pbVar12)) {
              memset(__s,0x5c,(ulong)(iVar16 - 2));
            }
            pbVar12 = __s + (((long)pbVar11 - (long)pbVar12 << 0x20) + -0x200000000 >> 0x20);
            __s = pbVar12 + 1;
            *pbVar12 = 0x3a;
            bVar3 = false;
            goto LAB_00125015;
          }
          if (bVar5 < 0xb) {
            if (bVar5 == 0) {
LAB_001251df:
              bVar3 = true;
              goto LAB_00125015;
            }
            lVar10 = 1;
            if (bVar5 != 10) goto LAB_00125239;
          }
          else {
            if (bVar5 != 0xd) {
LAB_0012508a:
              pbVar15 = pbVar11;
              if (bVar5 == 0x20) {
                pbVar11 = pbVar11 + 1;
                lVar10 = (long)((int)((int)pbVar11 - uVar14) / 2) + -1;
                if (__s < pbVar12) {
                  memset(__s,0x5c,(long)(int)lVar10);
                }
                pbVar12 = __s + lVar10;
                __s = pbVar12 + 1;
                *pbVar12 = 0x20;
                goto LAB_00124f87;
              }
              goto LAB_00125239;
            }
            bVar3 = true;
            lVar10 = 2;
            if (pbVar12[2] != 10) goto LAB_00125015;
          }
          pbVar12 = pbVar12 + lVar10;
        }
LAB_00125000:
        pbVar11 = pbVar12 + 1;
        bVar3 = true;
      }
LAB_00125015:
      this_00 = local_40;
      pbVar12 = pbVar11;
    } while (!bVar3);
    uVar14 = (int)__s - (int)local_50;
    bVar3 = bVar4;
    if ((0 < (int)uVar14) && (local_50[uVar14 - 1] == 0x3a)) {
      uVar14 = uVar14 - 1;
      bVar6 = true;
      bVar3 = false;
    }
    if ((int)uVar14 < 1) {
LAB_00125347:
      if (bVar9) {
        bVar13 = false;
        bVar3 = true;
      }
      bVar9 = true;
      bVar4 = bVar3;
    }
    else {
      local_68.len_ = (size_t)uVar14;
      local_68.str_ = (char *)local_50;
      _Var8 = std::
              __find_if<__gnu_cxx::__normal_iterator<StringPiece*,std::vector<StringPiece,std::allocator<StringPiece>>>,__gnu_cxx::__ops::_Iter_equals_val<StringPiece_const>>
                        ((local_40->ins_).
                         super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         (local_40->ins_).
                         super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_68);
      iVar2._M_current =
           (this_00->ins_).super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (_Var8._M_current == iVar2._M_current) {
        if (bVar4) {
          _Var8 = std::
                  __find_if<__gnu_cxx::__normal_iterator<StringPiece*,std::vector<StringPiece,std::allocator<StringPiece>>>,__gnu_cxx::__ops::_Iter_equals_val<StringPiece_const>>
                            ((this_00->outs_).
                             super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                             super__Vector_impl_data._M_start,
                             (this_00->outs_).
                             super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                             super__Vector_impl_data._M_finish,&local_68);
          iVar2._M_current =
               (this_00->outs_).super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          bVar4 = true;
          if (_Var8._M_current == iVar2._M_current) {
            if (iVar2._M_current ==
                (this_00->outs_).super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<StringPiece,std::allocator<StringPiece>>::
              _M_realloc_insert<StringPiece_const&>
                        ((vector<StringPiece,std::allocator<StringPiece>> *)this_00,iVar2,&local_68)
              ;
            }
            else {
              (iVar2._M_current)->str_ = local_68.str_;
              (iVar2._M_current)->len_ = local_68.len_;
              ppSVar1 = &(this_00->outs_).
                         super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppSVar1 = *ppSVar1 + 1;
            }
          }
        }
        else {
          if (!bVar13) {
            if (iVar2._M_current ==
                (this_00->ins_).super__Vector_base<StringPiece,_std::allocator<StringPiece>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<StringPiece,std::allocator<StringPiece>>::
              _M_realloc_insert<StringPiece_const&>(local_48,iVar2,&local_68);
            }
            else {
              (iVar2._M_current)->str_ = local_68.str_;
              (iVar2._M_current)->len_ = local_68.len_;
              ppSVar1 = &(this_00->ins_).
                         super__Vector_base<StringPiece,_std::allocator<StringPiece>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppSVar1 = *ppSVar1 + 1;
            }
            goto LAB_00125337;
          }
          bVar4 = false;
          std::__cxx11::string::_M_replace
                    ((ulong)local_58,0,(char *)local_58->_M_string_length,0x129680);
        }
      }
      else {
        if (bVar4) {
          bVar13 = true;
        }
LAB_00125337:
        bVar4 = true;
      }
      if (bVar4) goto LAB_00125347;
      bVar9 = false;
      bVar4 = bVar3;
    }
    if (!bVar9) {
      return false;
    }
  } while( true );
}

Assistant:

bool DepfileParser::Parse(string* content, string* err) {
  // in: current parser input point.
  // end: end of input.
  // parsing_targets: whether we are parsing targets or dependencies.
  char* in = &(*content)[0];
  char* end = in + content->size();
  bool have_target = false;
  bool parsing_targets = true;
  bool poisoned_input = false;
  while (in < end) {
    bool have_newline = false;
    // out: current output point (typically same as in, but can fall behind
    // as we de-escape backslashes).
    char* out = in;
    // filename: start of the current parsed filename.
    char* filename = out;
    for (;;) {
      // start: beginning of the current parsed span.
      const char* start = in;
      char* yymarker = NULL;
      
    {
      unsigned char yych;
      static const unsigned char yybm[] = {
          0,   0,   0,   0,   0,   0,   0,   0, 
          0,   0,   0,   0,   0,   0,   0,   0, 
          0,   0,   0,   0,   0,   0,   0,   0, 
          0,   0,   0,   0,   0,   0,   0,   0, 
          0, 128,   0,   0,   0, 128,   0,   0, 
        128, 128,   0, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128,   0,   0, 128,   0,   0, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128,   0, 128,   0, 128, 
          0, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128,   0, 128, 128,   0, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
        128, 128, 128, 128, 128, 128, 128, 128, 
      };
      yych = *in;
      if (yybm[0+yych] & 128) {
        goto yy9;
      }
      if (yych <= '\r') {
        if (yych <= '\t') {
          if (yych >= 0x01) goto yy4;
        } else {
          if (yych <= '\n') goto yy6;
          if (yych <= '\f') goto yy4;
          goto yy8;
        }
      } else {
        if (yych <= '$') {
          if (yych <= '#') goto yy4;
          goto yy12;
        } else {
          if (yych <= '?') goto yy4;
          if (yych <= '\\') goto yy13;
          goto yy4;
        }
      }
      ++in;
      {
        break;
      }
yy4:
      ++in;
yy5:
      {
        // For any other character (e.g. whitespace), swallow it here,
        // allowing the outer logic to loop around again.
        break;
      }
yy6:
      ++in;
      {
        // A newline ends the current file name and the current rule.
        have_newline = true;
        break;
      }
yy8:
      yych = *++in;
      if (yych == '\n') goto yy6;
      goto yy5;
yy9:
      yych = *++in;
      if (yybm[0+yych] & 128) {
        goto yy9;
      }
yy11:
      {
        // Got a span of plain text.
        int len = (int)(in - start);
        // Need to shift it over if we're overwriting backslashes.
        if (out < start)
          memmove(out, start, len);
        out += len;
        continue;
      }
yy12:
      yych = *++in;
      if (yych == '$') goto yy14;
      goto yy5;
yy13:
      yych = *(yymarker = ++in);
      if (yych <= ' ') {
        if (yych <= '\n') {
          if (yych <= 0x00) goto yy5;
          if (yych <= '\t') goto yy16;
          goto yy17;
        } else {
          if (yych == '\r') goto yy19;
          if (yych <= 0x1F) goto yy16;
          goto yy21;
        }
      } else {
        if (yych <= '9') {
          if (yych == '#') goto yy23;
          goto yy16;
        } else {
          if (yych <= ':') goto yy25;
          if (yych == '\\') goto yy27;
          goto yy16;
        }
      }
yy14:
      ++in;
      {
        // De-escape dollar character.
        *out++ = '$';
        continue;
      }
yy16:
      ++in;
      goto yy11;
yy17:
      ++in;
      {
        // A line continuation ends the current file name.
        break;
      }
yy19:
      yych = *++in;
      if (yych == '\n') goto yy17;
      in = yymarker;
      goto yy5;
yy21:
      ++in;
      {
        // 2N+1 backslashes plus space -> N backslashes plus space.
        int len = (int)(in - start);
        int n = len / 2 - 1;
        if (out < start)
          memset(out, '\\', n);
        out += n;
        *out++ = ' ';
        continue;
      }
yy23:
      ++in;
      {
        // De-escape hash sign, but preserve other leading backslashes.
        int len = (int)(in - start);
        if (len > 2 && out < start)
          memset(out, '\\', len - 2);
        out += len - 2;
        *out++ = '#';
        continue;
      }
yy25:
      yych = *++in;
      if (yych <= '\f') {
        if (yych <= 0x00) goto yy28;
        if (yych <= 0x08) goto yy26;
        if (yych <= '\n') goto yy28;
      } else {
        if (yych <= '\r') goto yy28;
        if (yych == ' ') goto yy28;
      }
yy26:
      {
        // De-escape colon sign, but preserve other leading backslashes.
        // Regular expression uses lookahead to make sure that no whitespace
        // nor EOF follows. In that case it'd be the : at the end of a target
        int len = (int)(in - start);
        if (len > 2 && out < start)
          memset(out, '\\', len - 2);
        out += len - 2;
        *out++ = ':';
        continue;
      }
yy27:
      yych = *++in;
      if (yych <= ' ') {
        if (yych <= '\n') {
          if (yych <= 0x00) goto yy11;
          if (yych <= '\t') goto yy16;
          goto yy11;
        } else {
          if (yych == '\r') goto yy11;
          if (yych <= 0x1F) goto yy16;
          goto yy30;
        }
      } else {
        if (yych <= '9') {
          if (yych == '#') goto yy23;
          goto yy16;
        } else {
          if (yych <= ':') goto yy25;
          if (yych == '\\') goto yy32;
          goto yy16;
        }
      }
yy28:
      ++in;
      {
        // Backslash followed by : and whitespace.
        // It is therefore normal text and not an escaped colon
        int len = (int)(in - start - 1);
        // Need to shift it over if we're overwriting backslashes.
        if (out < start)
          memmove(out, start, len);
        out += len;
        if (*(in - 1) == '\n')
          have_newline = true;
        break;
      }
yy30:
      ++in;
      {
        // 2N backslashes plus space -> 2N backslashes, end of filename.
        int len = (int)(in - start);
        if (out < start)
          memset(out, '\\', len - 1);
        out += len - 1;
        break;
      }
yy32:
      yych = *++in;
      if (yych <= ' ') {
        if (yych <= '\n') {
          if (yych <= 0x00) goto yy11;
          if (yych <= '\t') goto yy16;
          goto yy11;
        } else {
          if (yych == '\r') goto yy11;
          if (yych <= 0x1F) goto yy16;
          goto yy21;
        }
      } else {
        if (yych <= '9') {
          if (yych == '#') goto yy23;
          goto yy16;
        } else {
          if (yych <= ':') goto yy25;
          if (yych == '\\') goto yy27;
          goto yy16;
        }
      }
    }

    }

    int len = (int)(out - filename);
    const bool is_dependency = !parsing_targets;
    if (len > 0 && filename[len - 1] == ':') {
      len--;  // Strip off trailing colon, if any.
      parsing_targets = false;
      have_target = true;
    }

    if (len > 0) {
      StringPiece piece = StringPiece(filename, len);
      // If we've seen this as an input before, skip it.
      std::vector<StringPiece>::iterator pos = std::find(ins_.begin(), ins_.end(), piece);
      if (pos == ins_.end()) {
        if (is_dependency) {
          if (poisoned_input) {
            *err = "inputs may not also have inputs";
            return false;
          }
          // New input.
          ins_.push_back(piece);
        } else {
          // Check for a new output.
          if (std::find(outs_.begin(), outs_.end(), piece) == outs_.end())
            outs_.push_back(piece);
        }
      } else if (!is_dependency) {
        // We've passed an input on the left side; reject new inputs.
        poisoned_input = true;
      }
    }

    if (have_newline) {
      // A newline ends a rule so the next filename will be a new target.
      parsing_targets = true;
      poisoned_input = false;
    }
  }
  if (!have_target) {
    *err = "expected ':' in depfile";
    return false;
  }
  return true;
}